

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * CMU462::outer(Matrix3x3 *__return_storage_ptr__,Vector3D *u,Vector3D *v)

{
  double *Bij;
  Vector3D *v_local;
  Vector3D *u_local;
  Matrix3x3 *B;
  
  Matrix3x3::Matrix3x3(__return_storage_ptr__);
  __return_storage_ptr__->entries[0].x = u->x * v->x;
  __return_storage_ptr__->entries[0].y = u->y * v->x;
  __return_storage_ptr__->entries[0].z = u->z * v->x;
  __return_storage_ptr__->entries[1].x = u->x * v->y;
  __return_storage_ptr__->entries[1].y = u->y * v->y;
  __return_storage_ptr__->entries[1].z = u->z * v->y;
  __return_storage_ptr__->entries[2].x = u->x * v->z;
  __return_storage_ptr__->entries[2].y = u->y * v->z;
  __return_storage_ptr__->entries[2].z = u->z * v->z;
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 outer( const Vector3D& u, const Vector3D& v ) {
    Matrix3x3 B;
    double* Bij = (double*) &B;

    *Bij++ = u.x*v.x;
    *Bij++ = u.y*v.x;
    *Bij++ = u.z*v.x;
    *Bij++ = u.x*v.y;
    *Bij++ = u.y*v.y;
    *Bij++ = u.z*v.y;
    *Bij++ = u.x*v.z;
    *Bij++ = u.y*v.z;
    *Bij++ = u.z*v.z;

    return B;
  }